

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O0

qint64 __thiscall QDataStream::skipRawData(QDataStream *this,qint64 len)

{
  bool bVar1;
  long in_RSI;
  QDataStream *in_RDI;
  qint64 skipResult;
  QIODevice *in_stack_00000040;
  qint64 in_stack_00000068;
  qint64 local_8;
  
  if (in_RDI->dev == (QIODevice *)0x0) {
    local_8 = -1;
  }
  else if ((in_RDI->q_status == '\0') ||
          (bVar1 = QIODevice::isTransactionStarted((QIODevice *)0x4861d7), !bVar1)) {
    local_8 = QIODevice::skip(in_stack_00000040,in_stack_00000068);
    if (local_8 != in_RSI) {
      setStatus(in_RDI,ReadPastEnd);
    }
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

qint64 QDataStream::skipRawData(qint64 len)
{
    CHECK_STREAM_PRECOND(-1)
    if (q_status != Ok && dev->isTransactionStarted())
        return -1;

    const qint64 skipResult = dev->skip(len);
    if (skipResult != len)
        setStatus(ReadPastEnd);
    return skipResult;
}